

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O3

void __thiscall
libcellml::Variable::VariableImpl::setEquivalentConnectionId
          (VariableImpl *this,VariablePtr *equivalentVariable,string *id)

{
  _Atomic_word *p_Var1;
  int iVar2;
  mapped_type *pmVar3;
  VariableWeakPtr weakEquivalentVariable;
  key_type local_18;
  
  local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (equivalentVariable->super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>).
       _M_refcount._M_pi;
  if (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count =
           (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count =
           (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi)->_M_weak_count + 1;
    }
  }
  pmVar3 = std::
           map<std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::owner_less<std::weak_ptr<libcellml::Variable>_>,_std::allocator<std::pair<const_std::weak_ptr<libcellml::Variable>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->mConnectionIdMap,&local_18);
  std::__cxx11::string::_M_assign((string *)pmVar3);
  if (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_weak_count;
      iVar2 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar2 = (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_weak_count;
      (local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
      ->_M_weak_count = iVar2 + -1;
    }
    if (iVar2 == 1) {
      (*(local_18.super___weak_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  return;
}

Assistant:

void Variable::VariableImpl::setEquivalentConnectionId(const VariablePtr &equivalentVariable, const std::string &id)
{
    VariableWeakPtr weakEquivalentVariable = equivalentVariable;
    mConnectionIdMap[weakEquivalentVariable] = id;
}